

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O2

void __thiscall Gillespie::Initialize(Gillespie *this)

{
  pointer psVar1;
  runtime_error *this_00;
  long lVar2;
  ulong uVar3;
  __shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  if (this->initialized_ == false) {
    lVar2 = 0;
    for (uVar3 = 0;
        psVar1 = (this->reactions_).
                 super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->reactions_).
                              super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
        uVar3 = uVar3 + 1) {
      std::__shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&_Stack_38,
                 (__shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar1->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 lVar2));
      UpdatePropensity(this,(Ptr *)&_Stack_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
      lVar2 = lVar2 + 0x10;
    }
    this->initialized_ = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Gillespie: Reaction propensities have already been initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Gillespie::Initialize() {
  // Check that propensities have not already been initialized.
  if (initialized_ == true) {
    throw std::runtime_error(
        "Gillespie: Reaction propensities have already been initialized.");
  }
  // Update all propensities
  for (int i = 0; i < reactions_.size(); i++) {
    UpdatePropensity(reactions_[i]);
  }
  // Make sure prop sum is starting from 0, sum over all propensities.
  // alpha_sum_ = 0;
  // for (const auto &alpha : alpha_list_) {
  //  alpha_sum_ += alpha;
  // }
  initialized_ = true;
}